

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.cpp
# Opt level: O1

int npas4::impl::ParseLine(char *line)

{
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  char *__nptr;
  
  sVar3 = strlen(line);
  __nptr = line + -1;
  do {
    pcVar1 = __nptr + 1;
    __nptr = __nptr + 1;
  } while ((byte)(*pcVar1 - 0x3aU) < 0xf6);
  __nptr[sVar3 - 3] = '\0';
  iVar2 = atoi(__nptr);
  return iVar2;
}

Assistant:

int ParseLine(char* line)
		{
			const auto i = strlen(line);

			while(*line < '0' || *line > '9')
			{
				line++;
			}

			line[i - 3] = '\0';
			return atoi(line);
		}